

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_53533::ParserImpl::ParseArgs(ParserImpl *this)

{
  TokenDetail *pTVar1;
  undefined8 uVar2;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *arg_00;
  __uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> in_RDI;
  bool bVar3;
  ArgType type;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> arg;
  TokenDetail *in_stack_ffffffffffffff48;
  ParserImpl *in_stack_ffffffffffffff50;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *this_00;
  FuncCallArgs *in_stack_ffffffffffffff60;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> local_48;
  TokenDetail *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  ParseException *in_stack_ffffffffffffffd0;
  ParserImpl *in_stack_ffffffffffffffe8;
  
  pTVar1 = LookAhead(in_stack_ffffffffffffff50);
  bVar3 = true;
  if (pTVar1->token_ != 0x116) {
    pTVar1 = LookAhead(in_stack_ffffffffffffff50);
    bVar3 = true;
    if (pTVar1->token_ != 0x7b) {
      pTVar1 = LookAhead(in_stack_ffffffffffffff50);
      bVar3 = pTVar1->token_ == 0x28;
    }
  }
  if (bVar3) {
    std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
    unique_ptr<std::default_delete<luna::SyntaxTree>,void>
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff50);
    pTVar1 = LookAhead(in_stack_ffffffffffffff50);
    if (pTVar1->token_ == 0x116) {
      operator_new(0x30);
      NextToken(in_stack_ffffffffffffff50);
      luna::Terminator::Terminator
                ((Terminator *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::reset
                ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                 in_stack_ffffffffffffff50,(pointer)in_stack_ffffffffffffff48);
    }
    else {
      pTVar1 = LookAhead(in_stack_ffffffffffffff50);
      if (pTVar1->token_ == 0x7b) {
        ParseTableConstructor(in_stack_ffffffffffffffe8);
        std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator=
                  ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                   in_stack_ffffffffffffff50,
                   (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                   in_stack_ffffffffffffff48);
        std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
                  ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                   in_stack_ffffffffffffff60);
      }
      else {
        NextToken(in_stack_ffffffffffffff50);
        pTVar1 = LookAhead(in_stack_ffffffffffffff50);
        if (pTVar1->token_ != 0x29) {
          ParseExpList(in_stack_ffffffffffffffe8);
          std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator=
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     in_stack_ffffffffffffff50,
                     (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     in_stack_ffffffffffffff48);
          std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     in_stack_ffffffffffffff60);
        }
        pTVar1 = NextToken(in_stack_ffffffffffffff50);
        if (pTVar1->token_ != 0x29) {
          uVar2 = __cxa_allocate_exception(0x20);
          luna::ParseException::ParseException
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
          __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
        }
      }
    }
    arg_00 = (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             operator_new(0x18);
    this_00 = &local_48;
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::unique_ptr
              (this_00,(unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                       in_stack_ffffffffffffff48);
    luna::FuncCallArgs::FuncCallArgs
              (in_stack_ffffffffffffff60,arg_00,(ArgType)((ulong)this_00 >> 0x20));
    std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
    unique_ptr<std::default_delete<luna::SyntaxTree>,void>
              (this_00,(pointer)in_stack_ffffffffffffff48);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff60);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff60);
    return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
           (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
           in_RDI.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>.
           _M_t.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  }
  __assert_fail("LookAhead().token_ == Token_String || LookAhead().token_ == \'{\' || LookAhead().token_ == \'(\'"
                ,"/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                ,0x2c4,"std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseArgs()")
  ;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseArgs()
        {
            assert(LookAhead().token_ == Token_String ||
                   LookAhead().token_ == '{' ||
                   LookAhead().token_ == '(');

            std::unique_ptr<SyntaxTree> arg;
            FuncCallArgs::ArgType type;

            if (LookAhead().token_ == Token_String)
            {
                type = FuncCallArgs::String;
                arg.reset(new Terminator(NextToken()));
            }
            else if (LookAhead().token_ == '{')
            {
                type = FuncCallArgs::Table;
                arg = ParseTableConstructor();
            }
            else
            {
                type = FuncCallArgs::ExpList;
                NextToken();            // skip '('
                if (LookAhead().token_ != ')')
                    arg = ParseExpList();

                if (NextToken().token_ != ')')
                    throw ParseException("expect ')' to end function call args", current_);
            }

            return std::unique_ptr<SyntaxTree>(new FuncCallArgs(std::move(arg), type));
        }